

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::
TestFactoryImpl<gtest_suite_FlatBlockEstimatorTest_::FindFlatBlocks<BitDepthParams<unsigned_short,_10,_true>_>_>
::CreateTest(TestFactoryImpl<gtest_suite_FlatBlockEstimatorTest_::FindFlatBlocks<BitDepthParams<unsigned_short,_10,_true>_>_>
             *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x30);
  gtest_suite_FlatBlockEstimatorTest_::FindFlatBlocks<BitDepthParams<unsigned_short,_10,_true>_>::
  FindFlatBlocks((FindFlatBlocks<BitDepthParams<unsigned_short,_10,_true>_> *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }